

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagged_union.hpp
# Opt level: O0

void __thiscall
type_safe::tagged_union<int,evil_variant_test_type>::
emplace<evil_variant_test_type,char_const(&)[13]>
          (tagged_union<int,evil_variant_test_type> *this,char *param_2)

{
  evil_variant_test_type *this_00;
  type_id index;
  char (*args_local) [13];
  tagged_union<int,_evil_variant_test_type> *this_local;
  
  this_00 = (evil_variant_test_type *)
            detail::aligned_union<int,_evil_variant_test_type>::get
                      ((aligned_union<int,_evil_variant_test_type> *)this);
  evil_variant_test_type::evil_variant_test_type(this_00,param_2);
  *(undefined8 *)(this + 8) = 2;
  return;
}

Assistant:

void emplace(union_type<T>, Args&&... args)
    {
        constexpr auto index = type_id(union_type<T>{});
        // MSVC doesn't like operator!= of the strong typedef here, for some reason...
        static_assert(get(index) != get(invalid_type), "T must not be stored in variant");
        static_assert(std::is_constructible<T, Args&&...>::value,
                      "T not constructible from arguments");

        ::new (storage_.get()) T(std::forward<Args>(args)...);
        cur_type_ = index;
    }